

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mconv.cpp
# Opt level: O3

int CheckV2MVersion(uchar *inptr,int inlen,ssbase *base)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  undefined1 *puVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  ssbase base_1;
  uint local_acc;
  long local_a90;
  uint *local_a88;
  int local_a80;
  int local_a7c;
  undefined4 local_a78;
  uchar *local_a70;
  int local_a68;
  uint local_a60 [2];
  undefined8 local_a58;
  int local_a50 [2];
  undefined8 local_a48;
  int local_a40 [2];
  long local_a38 [2];
  undefined1 local_a28 [2512];
  int local_58;
  uint local_54;
  uint local_50;
  long local_40;
  int local_38;
  
  memset(&local_a90,0,0xa60);
  if (0xb < inlen) {
    local_a80 = *(int *)inptr;
    local_a7c = local_a80 * 10000;
    local_a78 = *(undefined4 *)(inptr + 4);
    local_a68 = *(int *)(inptr + 8);
    local_a70 = inptr + 0xc;
    if ((uint)(local_a68 * 10) <= inlen - 0xcU) {
      puVar6 = (uint *)(local_a70 + (uint)(local_a68 * 10));
      puVar11 = local_a28;
      lVar14 = 0;
      do {
        uVar5 = *puVar6;
        local_a60[lVar14 * 0x28] = uVar5;
        puVar6 = puVar6 + 1;
        if (uVar5 != 0) {
          *(uint **)(local_a50 + lVar14 * 0x28 + -2) = puVar6;
          uVar16 = (ulong)(uVar5 * 5);
          iVar13 = *(int *)((long)puVar6 + uVar16);
          local_a50[lVar14 * 0x28] = iVar13;
          *(int **)(local_a40 + lVar14 * 0x28 + -2) = (int *)((long)puVar6 + uVar16) + 1;
          uVar18 = (ulong)(uint)(iVar13 << 2);
          lVar15 = (long)puVar6 + uVar18 + 8 + uVar16;
          iVar13 = *(int *)(lVar15 + -4);
          local_a40[lVar14 * 0x28] = iVar13;
          local_a38[lVar14 * 0x14] = lVar15;
          puVar6 = (uint *)((long)puVar6 + (ulong)(uint)(iVar13 * 5) + uVar18 + uVar16 + 8);
          lVar15 = 0;
          do {
            uVar5 = *puVar6;
            *(uint *)(puVar11 + lVar15 + -8) = uVar5;
            *(uint **)(puVar11 + lVar15) = puVar6 + 1;
            puVar6 = (uint *)((long)puVar6 + (ulong)(uVar5 << 2) + 4);
            lVar15 = lVar15 + 0x10;
          } while (lVar15 != 0x70);
        }
        lVar14 = lVar14 + 1;
        puVar11 = puVar11 + 0xa0;
      } while (lVar14 != 0x10);
      local_58 = (int)puVar6 - (int)inptr;
      local_50 = *puVar6;
      uVar16 = (ulong)local_50;
      if (uVar16 < 0x20001) {
        local_a88 = puVar6 + 1;
        local_54 = *(uint *)((long)puVar6 + uVar16 + 4);
        if ((ulong)local_54 < 0x100001) {
          local_a90 = (long)puVar6 + uVar16 + 8;
          lVar14 = local_54 + uVar16;
          piVar7 = (int *)((long)puVar6 + lVar14 + 8);
          if ((long)piVar7 - (long)inptr < (long)(ulong)(uint)inlen) {
            local_38 = *piVar7;
            local_40 = (long)puVar6 + lVar14 + 0xc;
            if ((long)((long)piVar7 + (((long)local_38 + 4U) - (long)inptr)) <=
                (long)(ulong)(uint)inlen && (ulong)(long)local_38 < 0x2001) goto LAB_001073d2;
          }
          local_38 = 0;
          local_40 = 0;
        }
      }
    }
  }
LAB_001073d2:
  memcpy(base,&local_a90,0xa60);
  iVar13 = -1;
  if (base->patchsize != 0) {
    base->maxp = 0;
    lVar14 = 0;
    local_acc = 0;
    do {
      uVar5 = base->chan[lVar14].pcnum;
      uVar16 = (ulong)uVar5;
      uVar1 = base->chan[lVar14].notenum;
      lVar15 = (long)(int)uVar1;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
        iVar13 = 0;
      }
      else {
        puVar2 = base->chan[lVar14].pcptr;
        uVar18 = 0;
        iVar4 = 0;
        iVar13 = 0;
        iVar12 = 0;
        bVar10 = 0;
        do {
          iVar12 = ((uint)puVar2[uVar18] |
                   (uint)puVar2[uVar18 + uVar16] << 8 | (uint)puVar2[uVar18 + uVar16 * 2] << 0x10) +
                   iVar12;
          if ((iVar4 < iVar12) && (local_acc <= bVar10)) {
            local_acc = bVar10 + 1;
            base->maxp = local_acc;
          }
          bVar10 = bVar10 + puVar2[uVar18 + uVar16 * 3];
          if ((iVar13 < (int)uVar1) && (iVar4 <= iVar12)) {
            puVar3 = base->chan[lVar14].noteptr;
            lVar9 = (long)iVar13;
            do {
              lVar8 = lVar9 + 1;
              iVar4 = ((uint)puVar3[lVar9] |
                      (uint)puVar3[lVar8 + lVar15 + -1] << 8 |
                      (uint)puVar3[lVar8 + lVar15 * 2 + -1] << 0x10) + iVar4;
              iVar13 = iVar13 + 1;
              if (lVar15 <= lVar8) break;
              lVar9 = lVar8;
            } while (iVar4 <= iVar12);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar16);
        uVar5 = (uint)bVar10;
      }
      if ((iVar13 < (int)uVar1) && (local_acc <= uVar5)) {
        local_acc = uVar5 + 1;
        base->maxp = local_acc;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x10);
    iVar13 = -1;
    if (local_acc != 0) {
      if (v2version < 0) {
        iVar13 = -2;
      }
      else {
        puVar2 = base->patchmap;
        local_acc = local_acc - 1;
        uVar16 = 0;
        uVar18 = 0;
        if (0 < (int)local_acc) {
          uVar18 = (ulong)local_acc;
        }
        uVar17 = 0xffffffff;
        iVar4 = 0;
        do {
          if (base->globsize == v2gsizes[uVar16]) {
            uVar19 = 0;
            do {
              uVar20 = uVar18;
              if (uVar18 == uVar19) goto LAB_00107633;
              lVar14 = uVar19 * 4;
              iVar13 = *(int *)(puVar2 + uVar19 * 4 + 4) -
                       (*(int *)(puVar2 + lVar14) + v2vsizes[uVar16]);
              uVar20 = uVar19;
              if (0x55555554 < iVar13 * -0x55555555 + 0x2aaaaba9U) goto LAB_00107633;
              uVar19 = uVar19 + 1;
            } while ((iVar13 + 0x2fd) / 3 ==
                     (uint)puVar2[(*(int *)(puVar2 + lVar14) + v2vsizes[uVar16]) - 0x2fe]);
            uVar20 = (ulong)((int)uVar19 - 1);
LAB_00107633:
            bVar21 = (uint)uVar20 == local_acc;
            if (bVar21) {
              uVar17 = uVar16 & 0xffffffff;
            }
            iVar4 = iVar4 + (uint)bVar21;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != (ulong)(uint)v2version + 1);
        iVar13 = -2;
        if (0 < iVar4) {
          iVar13 = v2version - (int)uVar17;
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int CheckV2MVersion(const unsigned char *inptr, const int inlen, ssbase& base)
{
    int i;
    int patchesused[128];
    base = readfile(inptr,inlen);

    if (!base.patchsize)
        return -1;

    // determine highest used patch from progchange commands
    // (midiconv remaps the patches so that they're a
    //  continuous block from 0 to x)
    memset(patchesused, 0, sizeof(patchesused));
    base.maxp = 0;


    for (int ch = 0; ch < 16; ch++)
    {
        unsigned char p = 0;
        unsigned char v = 0;

        //int pcp = 0;
        int pct = 0;
        int pcn = base.chan[ch].pcnum;
        int np = 0;
        int nt = 0;
        int nn = base.chan[ch].notenum;

        int td;
        const uint8_t *ptr;
        for (int pcp = 0; pcp < pcn; pcp++)
        {
            // have there been notes? add last pgm
            ptr = base.chan[ch].pcptr;
            td  = 0x10000*ptr[2*pcn + pcp] + 0x100*ptr[1*pcn + pcp] + ptr[0*pcn + pcp];
            pct += td;
            if (pct > nt)
            {
                patchesused[p] = 1;
                if (p >= base.maxp) base.maxp = p + 1;
            }
            p += ptr[3*pcn + pcp];

            // walk notes until we reach current cmd
            while (np < nn && nt <= pct)
            {
                ptr = base.chan[ch].noteptr;
                td  = 0x10000*ptr[2*nn + np] + 0x100*ptr[1*nn + np] + ptr[0*nn + np];
                v  += ptr[4*nn+np];
                nt += td;
                np++;
            }
        }

        if (np < nn)
        {
            patchesused[p] = 1;
            if (p >= base.maxp) base.maxp = p + 1;
        }

    }
    printf2("patches used: %d\n", base.maxp);

    if (!base.maxp)
        return -1;

    // offset table to ptaches
    uint32_t *poffsets = (uint32_t *)base.patchmap;

    int matches = 0, best = -1;
    // for each version check...
    for (i = 0; i <= v2version; i++)
    {
        // ... if globals size is correct...
        if (base.globsize == v2gsizes[i])
        {
            printf2("globsize match: %d\n",i);
            // ... and if the size of all patches makes sense
            int p;
            for (p = 0; p < base.maxp - 1; p++)
            {
                int d = (poffsets[p + 1] - poffsets[p]) - (v2vsizes[i] - 3*255);
                if (d % 3) break;
                d /= 3;
                if (d != base.patchmap[poffsets[p] + v2vsizes[i] - 3*255 - 1])
                    break;
            }

            if (p == base.maxp - 1)
            {
                printf2("... ok!\n");
                best = i;
                matches++;
            } else
            {
                printf2("no match!\n");
            }
        }
    }

    // if we've got exactly one match, we're quite sure
    int ret = (matches >= 1) ? v2version - best : -2;
    printf2("found version delta: %d\n", ret);
    return ret;
}